

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-seri.c
# Opt level: O1

void push_value(lua_State *L,read_block *rb,int type,int cookie)

{
  int iVar1;
  lua_Integer lVar2;
  uint cookie_00;
  ulong n;
  byte *pbVar3;
  char *pcVar4;
  uint *puVar5;
  lua_Number *plVar6;
  ushort *puVar7;
  
  switch(type) {
  case 0:
    lua_pushnil(L);
    return;
  case 1:
    lua_pushboolean(L,cookie);
    return;
  case 2:
    if (cookie != 8) {
      lVar2 = get_integer(L,rb,cookie);
      lua_pushinteger(L,lVar2);
      return;
    }
    if (rb->len < 8) {
      plVar6 = (lua_Number *)0x0;
    }
    else {
      iVar1 = rb->ptr;
      rb->ptr = iVar1 + 8;
      rb->len = rb->len + -8;
      plVar6 = (lua_Number *)(rb->buffer + iVar1);
    }
    if (plVar6 == (lua_Number *)0x0) {
      luaL_error(L,"Invalid serialize stream %d (line:%d)",(ulong)(uint)rb->len,0x195);
    }
    lua_pushnumber(L,*plVar6);
    return;
  case 3:
    if (rb->len < 8) {
      pcVar4 = (char *)0x0;
    }
    else {
      iVar1 = rb->ptr;
      rb->ptr = iVar1 + 8;
      rb->len = rb->len + -8;
      pcVar4 = rb->buffer + iVar1;
    }
    if (pcVar4 == (char *)0x0) {
      luaL_error(L,"Invalid serialize stream %d (line:%d)",(ulong)(uint)rb->len,0x19f);
    }
    lua_pushlightuserdata(L,*(void **)pcVar4);
    return;
  case 4:
    break;
  case 5:
    if (cookie != 4) {
      if (cookie == 2) {
        if (rb->len < 2) {
          puVar7 = (ushort *)0x0;
        }
        else {
          iVar1 = rb->ptr;
          rb->ptr = iVar1 + 2;
          rb->len = rb->len + -2;
          puVar7 = (ushort *)(rb->buffer + iVar1);
        }
        if (puVar7 == (ushort *)0x0) {
          luaL_error(L,"Invalid serialize stream %d (line:%d)",(ulong)(uint)rb->len,0x1eb);
        }
        cookie = (int)*puVar7;
        break;
      }
      luaL_error(L,"Invalid serialize stream %d (line:%d)",(ulong)(uint)rb->len,0x1f2);
    }
    if (rb->len < 4) {
      puVar5 = (uint *)0x0;
    }
    else {
      iVar1 = rb->ptr;
      rb->ptr = iVar1 + 4;
      rb->len = rb->len + -4;
      puVar5 = (uint *)(rb->buffer + iVar1);
    }
    if (puVar5 == (uint *)0x0) {
      luaL_error(L,"Invalid serialize stream %d (line:%d)",(ulong)(uint)rb->len,0x1f6);
    }
    cookie = *puVar5;
    break;
  case 6:
    if (cookie == 0x1f) {
      if (rb->len < 1) {
        pbVar3 = (byte *)0x0;
      }
      else {
        iVar1 = rb->ptr;
        rb->ptr = iVar1 + 1;
        rb->len = rb->len + -1;
        pbVar3 = (byte *)(rb->buffer + iVar1);
      }
      if (pbVar3 == (byte *)0x0) {
        luaL_error(L,"Invalid serialize stream %d (line:%d)",(ulong)(uint)rb->len,0x1b6);
      }
      cookie_00 = (uint)(*pbVar3 >> 3);
      if ((*pbVar3 & 7) != 2 || cookie_00 == 8) {
        luaL_error(L,"Invalid serialize stream %d (line:%d)",(ulong)(uint)rb->len,0x1bb);
      }
      lVar2 = get_integer(L,rb,cookie_00);
      cookie = (int)lVar2;
    }
    luaL_checkstack(L,0x14,(char *)0x0);
    lua_createtable(L,cookie,0);
    if (0 < cookie) {
      n = 1;
      do {
        unpack_one(L,rb);
        lua_rawseti(L,-2,n);
        n = n + 1;
      } while (cookie + 1 != n);
    }
    while( true ) {
      unpack_one(L,rb);
      iVar1 = lua_type(L,-1);
      if (iVar1 == 0) break;
      unpack_one(L,rb);
      lua_rawset(L,-3);
    }
    lua_settop(L,-2);
    return;
  default:
    luaL_error(L,"Invalid serialize stream %d (line:%d)",(ulong)(uint)rb->len,0x203);
    return;
  }
  get_buffer(L,rb,cookie);
  return;
}

Assistant:

static void
push_value(lua_State *L, struct read_block *rb, int type, int cookie) {
	switch(type) {
	case TYPE_NIL:
		lua_pushnil(L);
		break;
	case TYPE_BOOLEAN:
		lua_pushboolean(L,cookie);
		break;
	case TYPE_NUMBER:
		if (cookie == TYPE_NUMBER_REAL) {
			lua_pushnumber(L,get_real(L,rb));
		} else {
			lua_pushinteger(L, get_integer(L, rb, cookie));
		}
		break;
	case TYPE_USERDATA:
		lua_pushlightuserdata(L,get_pointer(L,rb));
		break;
	case TYPE_SHORT_STRING:
		get_buffer(L,rb,cookie);
		break;
	case TYPE_LONG_STRING: {
		if (cookie == 2) {
			uint16_t *plen = rb_read(rb, 2);
			if (plen == NULL) {
				invalid_stream(L,rb);
			}
			uint16_t n;
			memcpy(&n, plen, sizeof(n));
			get_buffer(L,rb,n);
		} else {
			if (cookie != 4) {
				invalid_stream(L,rb);
			}
			uint32_t *plen = rb_read(rb, 4);
			if (plen == NULL) {
				invalid_stream(L,rb);
			}
			uint32_t n;
			memcpy(&n, plen, sizeof(n));
			get_buffer(L,rb,n);
		}
		break;
	}
	case TYPE_TABLE: {
		unpack_table(L,rb,cookie);
		break;
	}
	default: {
		invalid_stream(L,rb);
		break;
	}
	}
}